

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Appearance_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Appearance_PDU *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  ostream *poVar4;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KUINT16 Tabs_02;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  LE_Header::GetAsString_abi_cxx11_(&local_1f8,&this->super_LE_Header);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-Appearance PDU-\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Optional Field Flags:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tForce ID:              ",0x18);
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            (&local_1d8,(ENUMS *)(ulong)((this->m_AppearanceFlag1Union).m_ui8Flag & 1),Value);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tEntity Type:           ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tAlternate Entity Type: ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tEntity Marking:        ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tCapabilities:          ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tAppearance-Visual:     ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tAppearance-IR:         ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tFlag2:                 ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tAppearance-EM:         ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tAppearance-Audio:      ",0x18);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  if ((char)bVar3 < '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tAppearance-EM:         ",0x18);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tAppearance-Audio:      ",0x18);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Force ID:          ",0x13);
    DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
              (&local_1f8,(ENUMS *)(ulong)this->m_ui8ForceID,Value_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 2) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Entity Type:         ",0x15);
    DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_1f8,&this->m_EntityType);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Alternate Entity Type:         ",0x1f);
    DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_1f8,&this->m_AltEntityType);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 8) != 0) {
    DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_(&local_1f8,&this->m_EntityMarking);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 0x10) != 0) {
    DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_(&local_1f8,&this->m_EntityCapabilities);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 0x20) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Appearance-Visual:\n",0x13);
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
              (&local_1d8,&this->m_VisApp,&this->m_EntityType);
    UTILS::IndentString(&local_1f8,&local_1d8,Tabs,in_CL);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((bVar3 & 0x40) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Appearance-IR:\n",0xf);
    DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
              (&local_1d8,&this->m_IRApp,&this->m_EntityType);
    UTILS::IndentString(&local_1f8,&local_1d8,Tabs_00,in_CL);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = (this->m_AppearanceFlag1Union).m_ui8Flag;
  }
  if ((char)bVar3 < '\0') {
    bVar3 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    if ((bVar3 & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Appearance-EM:\n",0xf);
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
                (&local_1d8,&this->m_EMApp,&this->m_EntityType);
      UTILS::IndentString(&local_1f8,&local_1d8,Tabs_01,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = (this->m_AppearanceFlag2Union).m_ui8Flag;
    }
    if ((bVar3 & 2) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Appearance-Audio:\n",0x12);
      DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
                (&local_1d8,&this->m_AudApp,&this->m_EntityType);
      UTILS::IndentString(&local_1f8,&local_1d8,Tabs_02,in_CL);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString Appearance_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Appearance PDU-\n"
       << "Optional Field Flags:\n"
       << "\tForce ID:              " << GetEnumAsStringForceID( m_AppearanceFlag1Union.m_ui8ForceId ) << "\n"
       << "\tEntity Type:           " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Typ    << "\n"
       << "\tAlternate Entity Type: " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8AltTyp << "\n"
       << "\tEntity Marking:        " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Mark   << "\n"
       << "\tCapabilities:          " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Cap    << "\n"
       << "\tAppearance-Visual:     " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Vis    << "\n"
       << "\tAppearance-IR:         " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8IR     << "\n"
       << "\tFlag2:                 " << ( KUINT16 )m_AppearanceFlag1Union.m_ui8Flag2  << "\n"
       << "\tAppearance-EM:         " << ( KUINT16 )m_AppearanceFlag2Union.m_ui8EM     << "\n"
       << "\tAppearance-Audio:      " << ( KUINT16 )m_AppearanceFlag2Union.m_ui8Audio  << "\n";

    if (m_AppearanceFlag1Union.m_ui8Flag2)
    {
        ss << "\tAppearance-EM:         " << (KUINT16)m_AppearanceFlag2Union.m_ui8EM << "\n"
           << "\tAppearance-Audio:      " << (KUINT16)m_AppearanceFlag2Union.m_ui8Audio << "\n";
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        ss << "Force ID:          " << GetEnumAsStringForceID( m_ui8ForceID ) << "\n";
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        ss << "Entity Type:         " << m_EntityType.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        ss << "Alternate Entity Type:         " << m_AltEntityType.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        ss << m_EntityMarking.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        ss << m_EntityCapabilities.GetAsString();
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        ss << "Appearance-Visual:\n" << IndentString( m_VisApp.GetAsString( m_EntityType ), 1 );
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        ss << "Appearance-IR:\n" << IndentString( m_IRApp.GetAsString( m_EntityType ), 1 );
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            ss << "Appearance-EM:\n" << IndentString( m_EMApp.GetAsString( m_EntityType ), 1 );
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            ss << "Appearance-Audio:\n" << IndentString( m_AudApp.GetAsString( m_EntityType ), 1 );
        }
    }

    return ss.str();
}